

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

basic_value<toml::type_config> * __thiscall
toml::basic_value<toml::type_config>::operator=
          (basic_value<toml::type_config> *this,basic_value<toml::type_config> *v)

{
  basic_value<toml::type_config> *in_RSI;
  basic_value<toml::type_config> *in_RDI;
  region *in_stack_ffffffffffffffc8;
  region *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe7;
  basic_value<toml::type_config> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    cleanup(in_RDI,(EVP_PKEY_CTX *)in_RSI);
    in_RDI->type_ = in_RSI->type_;
    toml::detail::region::operator=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    preserve_comments::operator=
              ((preserve_comments *)in_stack_ffffffffffffffd0,
               (preserve_comments *)in_stack_ffffffffffffffc8);
    switch(in_RDI->type_) {
    case boolean:
      assigner<toml::detail::value_with_format<bool,toml::boolean_format_info>,toml::detail::value_with_format<bool,toml::boolean_format_info>>
                (&(in_RDI->field_1).boolean_,&(in_RSI->field_1).boolean_);
      local_8 = in_RDI;
      break;
    case integer:
      assigner<toml::detail::value_with_format<long,toml::integer_format_info>,toml::detail::value_with_format<long,toml::integer_format_info>>
                ((value_with_format<long,_toml::integer_format_info> *)
                 CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                 (value_with_format<long,_toml::integer_format_info> *)in_RDI);
      local_8 = in_RDI;
      break;
    case floating:
      assigner<toml::detail::value_with_format<double,toml::floating_format_info>,toml::detail::value_with_format<double,toml::floating_format_info>>
                ((value_with_format<double,_toml::floating_format_info> *)
                 CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                 (value_with_format<double,_toml::floating_format_info> *)in_RDI);
      local_8 = in_RDI;
      break;
    case string:
      assigner<toml::detail::value_with_format<std::__cxx11::string,toml::string_format_info>,toml::detail::value_with_format<std::__cxx11::string,toml::string_format_info>>
                ((value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                  *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                 (value_with_format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::string_format_info>
                  *)in_RDI);
      local_8 = in_RDI;
      break;
    case offset_datetime:
      assigner<toml::detail::value_with_format<toml::offset_datetime,toml::offset_datetime_format_info>,toml::detail::value_with_format<toml::offset_datetime,toml::offset_datetime_format_info>>
                ((value_with_format<toml::offset_datetime,_toml::offset_datetime_format_info> *)
                 &(in_RDI->field_1).boolean_,
                 (value_with_format<toml::offset_datetime,_toml::offset_datetime_format_info> *)
                 &(in_RSI->field_1).boolean_);
      local_8 = in_RDI;
      break;
    case local_datetime:
      assigner<toml::detail::value_with_format<toml::local_datetime,toml::local_datetime_format_info>,toml::detail::value_with_format<toml::local_datetime,toml::local_datetime_format_info>>
                ((value_with_format<toml::local_datetime,_toml::local_datetime_format_info> *)
                 &(in_RDI->field_1).boolean_,
                 (value_with_format<toml::local_datetime,_toml::local_datetime_format_info> *)
                 &(in_RSI->field_1).boolean_);
      local_8 = in_RDI;
      break;
    case local_date:
      assigner<toml::detail::value_with_format<toml::local_date,toml::local_date_format_info>,toml::detail::value_with_format<toml::local_date,toml::local_date_format_info>>
                ((value_with_format<toml::local_date,_toml::local_date_format_info> *)
                 &(in_RDI->field_1).boolean_,
                 (value_with_format<toml::local_date,_toml::local_date_format_info> *)
                 &(in_RSI->field_1).boolean_);
      local_8 = in_RDI;
      break;
    case local_time:
      assigner<toml::detail::value_with_format<toml::local_time,toml::local_time_format_info>,toml::detail::value_with_format<toml::local_time,toml::local_time_format_info>>
                ((value_with_format<toml::local_time,_toml::local_time_format_info> *)
                 &(in_RDI->field_1).boolean_,
                 (value_with_format<toml::local_time,_toml::local_time_format_info> *)
                 &(in_RSI->field_1).boolean_);
      local_8 = in_RDI;
      break;
    case array:
      assigner<toml::detail::value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>>,toml::array_format_info>,toml::detail::value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,std::allocator<toml::basic_value<toml::type_config>>>>,toml::array_format_info>>
                ((value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                  *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                 (value_with_format<toml::detail::storage<std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>,_toml::array_format_info>
                  *)in_RDI);
      local_8 = in_RDI;
      break;
    case table:
      assigner<toml::detail::value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::type_config>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>>>,toml::table_format_info>,toml::detail::value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::string,toml::basic_value<toml::type_config>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>>>,toml::table_format_info>>
                ((value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                  *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
                 (value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                  *)in_RDI);
      local_8 = in_RDI;
      break;
    default:
      assigner<char,char>(&(in_RDI->field_1).empty_,&stack0xffffffffffffffe7);
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

basic_value& operator=(basic_value&& v)
    {
        if(this == std::addressof(v)) {return *this;}

        this->cleanup();
        this->type_     = v.type_;
        this->region_   = std::move(v.region_);
        this->comments_ = std::move(v.comments_);
        switch(this->type_)
        {
            case value_t::boolean        : assigner(boolean_        , std::move(v.boolean_        )); break;
            case value_t::integer        : assigner(integer_        , std::move(v.integer_        )); break;
            case value_t::floating       : assigner(floating_       , std::move(v.floating_       )); break;
            case value_t::string         : assigner(string_         , std::move(v.string_         )); break;
            case value_t::offset_datetime: assigner(offset_datetime_, std::move(v.offset_datetime_)); break;
            case value_t::local_datetime : assigner(local_datetime_ , std::move(v.local_datetime_ )); break;
            case value_t::local_date     : assigner(local_date_     , std::move(v.local_date_     )); break;
            case value_t::local_time     : assigner(local_time_     , std::move(v.local_time_     )); break;
            case value_t::array          : assigner(array_          , std::move(v.array_          )); break;
            case value_t::table          : assigner(table_          , std::move(v.table_          )); break;
            default                      : assigner(empty_          , '\0'                         ); break;
        }
        return *this;
    }